

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_siPrefixes_Test::TestBody(unitStrings_siPrefixes_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  precise_unit *ppVar3;
  char *pcVar4;
  uint64_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  AssertHelper local_a70;
  Message local_a68;
  allocator local_a59;
  string local_a58;
  precise_unit local_a38;
  string local_a28;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_21;
  Message local_9f0;
  allocator local_9e1;
  string local_9e0;
  precise_unit local_9c0;
  string local_9b0;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_20;
  Message local_978;
  allocator local_969;
  string local_968;
  precise_unit local_948;
  string local_938;
  undefined1 local_918 [8];
  AssertionResult gtest_ar_19;
  Message local_900;
  allocator local_8f1;
  string local_8f0;
  precise_unit local_8d0;
  string local_8c0;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_18;
  Message local_888;
  allocator local_879;
  string local_878;
  precise_unit local_858;
  string local_848;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_17;
  Message local_810;
  allocator local_801;
  string local_800;
  precise_unit local_7e0;
  string local_7d0;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_16;
  Message local_798;
  allocator local_789;
  string local_788;
  precise_unit local_768;
  string local_758;
  undefined1 local_738 [8];
  AssertionResult gtest_ar_15;
  Message local_720;
  allocator local_711;
  string local_710;
  precise_unit local_6f0;
  string local_6e0;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_14;
  Message local_6a8;
  allocator local_699;
  string local_698;
  precise_unit local_678;
  string local_668;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_13;
  Message local_630;
  allocator local_621;
  string local_620;
  precise_unit local_600;
  string local_5f0;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_12;
  Message local_5b8;
  allocator local_5a9;
  string local_5a8;
  precise_unit local_588;
  string local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_11;
  Message local_540;
  allocator local_531;
  string local_530;
  precise_unit local_510;
  string local_500;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_10;
  Message local_4c8;
  allocator local_4b9;
  string local_4b8;
  precise_unit local_498;
  string local_488;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_9;
  Message local_450;
  allocator local_441;
  string local_440;
  precise_unit local_420;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_8;
  Message local_3d8;
  allocator local_3c9;
  string local_3c8;
  precise_unit local_3a8;
  string local_398;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_7;
  Message local_360;
  allocator local_351;
  string local_350;
  precise_unit local_330;
  string local_320;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_6;
  Message local_2e8;
  allocator local_2d9;
  string local_2d8;
  precise_unit local_2b8;
  string local_2a8;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_5;
  Message local_270;
  allocator local_261;
  string local_260;
  precise_unit local_240;
  string local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_4;
  Message local_1f8;
  allocator local_1e9;
  string local_1e8;
  precise_unit local_1c8;
  string local_1b8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_3;
  Message local_180;
  allocator local_171;
  string local_170;
  precise_unit local_150;
  string local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  allocator local_f9;
  string local_f8;
  precise_unit local_d8;
  string local_c8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  allocator local_71;
  string local_70;
  precise_unit local_50;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_siPrefixes_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"mm",&local_71);
  uVar2 = units::getDefaultFlags();
  local_50 = units::unit_from_string(&local_70,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_40,(units *)&local_50,ppVar3,in_RCX);
  pbVar5 = &local_40;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_20,"to_string(unit_from_string(\"mm\"))","\"mm\"",pbVar5,
             (char (*) [3])0x283672);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x78;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"cm",&local_f9);
  uVar2 = units::getDefaultFlags();
  local_d8 = units::unit_from_string(&local_f8,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_c8,(units *)&local_d8,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_c8;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_a8,"to_string(unit_from_string(\"cm\"))","\"cm\"",pbVar5,
             (char (*) [3])0x282489);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x79;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x79,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"um",&local_171);
  uVar2 = units::getDefaultFlags();
  local_150 = units::unit_from_string(&local_170,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_140,(units *)&local_150,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_140;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_120,"to_string(unit_from_string(\"um\"))","\"um\"",pbVar5,
             (char (*) [3])0x294794);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"nm",&local_1e9);
  uVar2 = units::getDefaultFlags();
  local_1c8 = units::unit_from_string(&local_1e8,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_1b8,(units *)&local_1c8,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_1b8;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_198,"to_string(unit_from_string(\"nm\"))","\"nm\"",pbVar5,
             (char (*) [3])"nm");
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"pm",&local_261);
  uVar2 = units::getDefaultFlags();
  local_240 = units::unit_from_string(&local_260,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_230,(units *)&local_240,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_230;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_210,"to_string(unit_from_string(\"pm\"))","\"pm\"",pbVar5,
             (char (*) [3])0x29276e);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"fm",&local_2d9);
  uVar2 = units::getDefaultFlags();
  local_2b8 = units::unit_from_string(&local_2d8,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2a8,(units *)&local_2b8,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_2a8;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_288,"to_string(unit_from_string(\"fm\"))","\"fm\"",pbVar5,
             (char (*) [3])0x292c08);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"am",&local_351);
  uVar2 = units::getDefaultFlags();
  local_330 = units::unit_from_string(&local_350,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_320,(units *)&local_330,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_320;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_300,"to_string(unit_from_string(\"am\"))","\"am\"",pbVar5,
             (char (*) [3])0x29a126);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"zm",&local_3c9);
  uVar2 = units::getDefaultFlags();
  local_3a8 = units::unit_from_string(&local_3c8,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_398,(units *)&local_3a8,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_398;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_378,"to_string(unit_from_string(\"zm\"))","\"zm\"",pbVar5,
             (char (*) [3])"zm");
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7f;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,"ym",&local_441);
  uVar2 = units::getDefaultFlags();
  local_420 = units::unit_from_string(&local_440,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_410,(units *)&local_420,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_410;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_3f0,"to_string(unit_from_string(\"ym\"))","\"ym\"",pbVar5,
             (char (*) [3])"ym");
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x80;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x80,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"dm",&local_4b9);
  uVar2 = units::getDefaultFlags();
  local_498 = units::unit_from_string(&local_4b8,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_488,(units *)&local_498,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_488;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_468,"to_string(unit_from_string(\"dm\"))","\"dm\"",pbVar5,
             (char (*) [3])"dm");
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x81;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x81,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_530,"rm",&local_531);
  uVar2 = units::getDefaultFlags();
  local_510 = units::unit_from_string(&local_530,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_500,(units *)&local_510,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_500;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_4e0,"to_string(unit_from_string(\"rm\"))","\"rm\"",pbVar5,
             (char (*) [3])0x290072);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x82;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a8,"qm",&local_5a9);
  uVar2 = units::getDefaultFlags();
  local_588 = units::unit_from_string(&local_5a8,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_578,(units *)&local_588,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_578;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_558,"to_string(unit_from_string(\"qm\"))","\"qm\"",pbVar5,
             (char (*) [3])"qm");
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x83;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_620,"km",&local_621);
  uVar2 = units::getDefaultFlags();
  local_600 = units::unit_from_string(&local_620,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_5f0,(units *)&local_600,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_5f0;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_5d0,"to_string(unit_from_string(\"km\"))","\"km\"",pbVar5,
             (char (*) [3])0x280828);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x85;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x85,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_630);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_698,"Km",&local_699);
  uVar2 = units::getDefaultFlags();
  local_678 = units::unit_from_string(&local_698,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_668,(units *)&local_678,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_668;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_648,"to_string(unit_from_string(\"Km\"))","\"km\"",pbVar5,
             (char (*) [3])0x280828);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x86;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_710,"Mm",&local_711);
  uVar2 = units::getDefaultFlags();
  local_6f0 = units::unit_from_string(&local_710,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_6e0,(units *)&local_6f0,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_6e0;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_6c0,"to_string(unit_from_string(\"Mm\"))","\"Mm\"",pbVar5,
             (char (*) [3])"Mm");
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x87;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_720);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_788,"Gm",&local_789);
  uVar2 = units::getDefaultFlags();
  local_768 = units::unit_from_string(&local_788,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_758,(units *)&local_768,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_758;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_738,"to_string(unit_from_string(\"Gm\"))","\"Gm\"",pbVar5,
             (char (*) [3])"Gm");
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_738);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x88;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_800,"Tm",&local_801);
  uVar2 = units::getDefaultFlags();
  local_7e0 = units::unit_from_string(&local_800,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_7d0,(units *)&local_7e0,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_7d0;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_7b0,"to_string(unit_from_string(\"Tm\"))","\"Tm\"",pbVar5,
             (char (*) [3])"Tm");
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar1) {
    testing::Message::Message(&local_810);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7b0);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x89;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_878,"Em",&local_879);
  uVar2 = units::getDefaultFlags();
  local_858 = units::unit_from_string(&local_878,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_848,(units *)&local_858,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_848;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_828,"to_string(unit_from_string(\"Em\"))","\"Em\"",pbVar5,
             (char (*) [3])"Em");
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f0,"Zm",&local_8f1);
  uVar2 = units::getDefaultFlags();
  local_8d0 = units::unit_from_string(&local_8f0,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_8c0,(units *)&local_8d0,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_8c0;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_8a0,"to_string(unit_from_string(\"Zm\"))","\"Zm\"",pbVar5,
             (char (*) [3])"Zm");
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_900);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_900);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_968,"Ym",&local_969);
  uVar2 = units::getDefaultFlags();
  local_948 = units::unit_from_string(&local_968,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_938,(units *)&local_948,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_938;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_918,"to_string(unit_from_string(\"Ym\"))","\"Ym\"",pbVar5,
             (char (*) [3])"Ym");
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_918);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9e0,"Rm",&local_9e1);
  uVar2 = units::getDefaultFlags();
  local_9c0 = units::unit_from_string(&local_9e0,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_9b0,(units *)&local_9c0,ppVar3,(uint64_t)pbVar5);
  pbVar5 = &local_9b0;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_990,"to_string(unit_from_string(\"Rm\"))","\"Rm\"",pbVar5,
             (char (*) [3])"Rm");
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a58,"Qm",&local_a59);
  uVar2 = units::getDefaultFlags();
  local_a38 = units::unit_from_string(&local_a58,uVar2);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_a28,(units *)&local_a38,ppVar3,(uint64_t)pbVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_a08,"to_string(unit_from_string(\"Qm\"))","\"Qm\"",&local_a28,
             (char (*) [3])"Qm");
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a68);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              (&local_a70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a70,&local_a68);
    testing::internal::AssertHelper::~AssertHelper(&local_a70);
    testing::Message::~Message(&local_a68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  return;
}

Assistant:

TEST(unitStrings, siPrefixes)
{
    EXPECT_EQ(to_string(unit_from_string("mm")), "mm");
    EXPECT_EQ(to_string(unit_from_string("cm")), "cm");
    EXPECT_EQ(to_string(unit_from_string("um")), "um");
    EXPECT_EQ(to_string(unit_from_string("nm")), "nm");
    EXPECT_EQ(to_string(unit_from_string("pm")), "pm");
    EXPECT_EQ(to_string(unit_from_string("fm")), "fm");
    EXPECT_EQ(to_string(unit_from_string("am")), "am");
    EXPECT_EQ(to_string(unit_from_string("zm")), "zm");
    EXPECT_EQ(to_string(unit_from_string("ym")), "ym");
    EXPECT_EQ(to_string(unit_from_string("dm")), "dm");
    EXPECT_EQ(to_string(unit_from_string("rm")), "rm");
    EXPECT_EQ(to_string(unit_from_string("qm")), "qm");

    EXPECT_EQ(to_string(unit_from_string("km")), "km");
    EXPECT_EQ(to_string(unit_from_string("Km")), "km");
    EXPECT_EQ(to_string(unit_from_string("Mm")), "Mm");
    EXPECT_EQ(to_string(unit_from_string("Gm")), "Gm");
    EXPECT_EQ(to_string(unit_from_string("Tm")), "Tm");
    EXPECT_EQ(to_string(unit_from_string("Em")), "Em");
    EXPECT_EQ(to_string(unit_from_string("Zm")), "Zm");
    EXPECT_EQ(to_string(unit_from_string("Ym")), "Ym");
    EXPECT_EQ(to_string(unit_from_string("Rm")), "Rm");
    EXPECT_EQ(to_string(unit_from_string("Qm")), "Qm");
}